

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  jpeg_d_coef_controller *pjVar2;
  long lVar3;
  long lVar4;
  jvirt_barray_ptr pjVar5;
  void *__s;
  _func_void_j_decompress_ptr **pp_Var6;
  JDIMENSION JVar7;
  int *piVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  pjVar2 = (jpeg_d_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xe0);
  cinfo->coef = pjVar2;
  pjVar2->start_input_pass = start_input_pass;
  pjVar2->start_output_pass = start_output_pass;
  pjVar2[5].start_output_pass = (_func_void_j_decompress_ptr *)0x0;
  if (need_full_buffer == 0) {
    __s = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    lVar3 = 0;
    lVar4 = 1;
    lVar9 = 0;
    auVar10._8_4_ = (int)__s;
    auVar10._0_8_ = __s;
    auVar10._12_4_ = (int)((ulong)__s >> 0x20);
    do {
      (&pjVar2[1].start_output_pass)[lVar9] =
           (_func_void_j_decompress_ptr *)(lVar3 * 0x80 + (long)__s);
      (&pjVar2[1].start_output_pass + lVar9)[1] =
           (_func_void_j_decompress_ptr *)(lVar4 * 0x80 + auVar10._8_8_);
      lVar9 = lVar9 + 2;
      lVar3 = lVar3 + 2;
      lVar4 = lVar4 + 2;
    } while (lVar9 != 10);
    if (cinfo->lim_Se == 0) {
      memset(__s,0,0x500);
    }
    pjVar2->consume_data = dummy_consume_data;
    pjVar2->decompress_data = decompress_onepass;
    pp_Var6 = (_func_void_j_decompress_ptr **)0x0;
  }
  else {
    if (0 < cinfo->num_components) {
      piVar8 = &cinfo->comp_info->h_samp_factor;
      lVar9 = 0;
      do {
        JVar7 = piVar8[1] * 3;
        if (cinfo->progressive_mode == 0) {
          JVar7 = piVar8[1];
        }
        p_Var1 = cinfo->mem->request_virt_barray;
        lVar3 = jround_up((ulong)(uint)piVar8[5],(long)*piVar8);
        lVar4 = jround_up((ulong)(uint)piVar8[6],(long)piVar8[1]);
        pjVar5 = (*p_Var1)((j_common_ptr)cinfo,1,1,(JDIMENSION)lVar3,(JDIMENSION)lVar4,JVar7);
        (&pjVar2[3].start_output_pass)[lVar9] = (_func_void_j_decompress_ptr *)pjVar5;
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 0x18;
      } while (lVar9 < cinfo->num_components);
    }
    pjVar2->consume_data = consume_data;
    pjVar2->decompress_data = decompress_data;
    pp_Var6 = &pjVar2[3].start_output_pass;
  }
  pjVar2->coef_arrays = (jvirt_barray_ptr *)pp_Var6;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *) coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
	access_rows *= 3;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, TRUE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    if (cinfo->lim_Se == 0)	/* DC only case: want to bypass later */
      FMEMZERO((void FAR *) buffer,
	       (size_t) (D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK)));
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }
}